

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_service_null(t_cpp_generator *this,t_service *tservice,string *style)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_function *tfunction;
  pointer pcVar3;
  t_type *type;
  string *psVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  pointer pptVar11;
  string extends;
  t_field returnfield_1;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_field returnfield;
  char *local_2b0;
  long local_2a8;
  char local_2a0 [16];
  string *local_290;
  string local_288;
  string local_268;
  undefined1 local_248 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_230 [9];
  string local_198;
  vector<t_function_*,_std::allocator<t_function_*>_> local_178;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_c8 [9];
  
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
  local_290 = style;
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_268,this,&tservice->extends_->super_t_type,false,false);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0x37ffe0);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_288.field_2._M_allocated_capacity = *psVar10;
      local_288.field_2._8_8_ = plVar7[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar10;
      local_288._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_288._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_288,(ulong)(style->_M_dataplus)._M_p);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      local_248._16_8_ = *psVar10;
      aaStack_230[0]._0_8_ = plVar7[3];
      local_248._0_8_ = local_248 + 0x10;
    }
    else {
      local_248._16_8_ = *psVar10;
      local_248._0_8_ = (size_type *)*plVar7;
    }
    local_248._8_8_ = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_248);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      local_e0._16_8_ = *psVar10;
      aaStack_c8[0]._0_8_ = plVar7[3];
      local_e0._0_8_ = local_e0 + 0x10;
    }
    else {
      local_e0._16_8_ = *psVar10;
      local_e0._0_8_ = (size_type *)*plVar7;
    }
    local_e0._8_8_ = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)local_e0);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
  }
  poVar1 = &this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"class ",6);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p
                      ,(this->super_t_oop_generator).super_t_generator.service_name_.
                       _M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(local_290->_M_dataplus)._M_p,local_290->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Null : virtual public ",0x16);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(local_290->_M_dataplus)._M_p,local_290->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"If",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2b0,local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," {",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," public:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_((string *)local_e0,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)local_e0._0_8_,local_e0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"virtual ~",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(local_290->_M_dataplus)._M_p,local_290->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Null() {}",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_178,&tservice->functions_)
  ;
  if (local_178.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_178.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar11 = local_178.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      t_generator::indent_abi_cxx11_((string *)local_e0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(char *)local_e0._0_8_,local_e0._8_8_);
      tfunction = *pptVar11;
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      pcVar3 = (local_290->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,pcVar3,pcVar3 + local_290->_M_string_length);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
      function_signature((string *)local_248,this,tfunction,&local_198,&local_100,false);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_248._0_8_,local_248._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," override {",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_);
      }
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      type = (*pptVar11)->returntype_;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"_return","");
      t_field::t_field((t_field *)local_e0,type,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      psVar4 = local_290;
      iVar6 = std::__cxx11::string::compare((char *)local_290);
      if (iVar6 == 0) {
        iVar6 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
        if (((char)iVar6 != '\0') || (bVar5 = is_complex_type(this,type), bVar5)) {
          t_generator::indent_abi_cxx11_((string *)local_248,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return;",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        else {
          t_generator::indent_abi_cxx11_((string *)local_248,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,(char *)local_248._0_8_,local_248._8_8_);
          declare_field_abi_cxx11_(&local_288,this,(t_field *)local_e0,true,false,false,false);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_288._M_dataplus._M_p,local_288._M_string_length);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_268._M_dataplus._M_p,local_268._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return _return;",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
        }
LAB_0018cde2:
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)psVar4);
        if (iVar6 != 0) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = "UNKNOWN STYLE";
          __cxa_throw(puVar9,&char_const*::typeinfo,0);
        }
        iVar6 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
        if ((char)iVar6 != '\0') {
          t_generator::indent_abi_cxx11_((string *)local_248,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return cob();",0xd);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          goto LAB_0018cde2;
        }
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"_return","");
        t_field::t_field((t_field *)local_248,type,&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,local_288._M_dataplus._M_p,local_288._M_string_length)
        ;
        declare_field_abi_cxx11_(&local_268,this,(t_field *)local_248,true,false,false,false);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_268._M_dataplus._M_p,local_268._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_160._M_dataplus._M_p,local_160._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return cob(_return);",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        t_field::~t_field((t_field *)local_248);
      }
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      t_generator::indent_abi_cxx11_((string *)local_248,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(char *)local_248._0_8_,local_248._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_);
      }
      t_field::~t_field((t_field *)local_e0);
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             local_178.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"};",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_178.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_service_null(t_service* tservice, string style) {
  string extends = "";
  if (tservice->get_extends() != nullptr) {
    extends = " , virtual public " + type_name(tservice->get_extends()) + style + "Null";
  }
  f_header_ << "class " << service_name_ << style << "Null : virtual public " << service_name_
            << style << "If" << extends << " {" << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << "virtual ~" << service_name_ << style << "Null() {}" << endl;
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_header_ << indent() << function_signature(*f_iter, style, "", false)
              << " override {" << endl;
    indent_up();

    t_type* returntype = (*f_iter)->get_returntype();
    t_field returnfield(returntype, "_return");

    if (style == "") {
      if (returntype->is_void() || is_complex_type(returntype)) {
        f_header_ << indent() << "return;" << endl;
      } else {
        f_header_ << indent() << declare_field(&returnfield, true) << endl << indent()
                  << "return _return;" << endl;
      }
    } else if (style == "CobSv") {
      if (returntype->is_void()) {
        f_header_ << indent() << "return cob();" << endl;
      } else {
        t_field returnfield(returntype, "_return");
        f_header_ << indent() << declare_field(&returnfield, true) << endl << indent()
                  << "return cob(_return);" << endl;
      }

    } else {
      throw "UNKNOWN STYLE";
    }

    indent_down();
    f_header_ << indent() << "}" << endl;
  }
  indent_down();
  f_header_ << "};" << endl << endl;
}